

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

string * __thiscall
Diligent::FormatString<char[34],unsigned_int,char[18],char_const*,char[48],char_const*,char[3]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [34],uint *Args_1,
          char (*Args_2) [18],char **Args_3,char (*Args_4) [48],char **Args_5,char (*Args_6) [3])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[34],unsigned_int,char[18],char_const*,char[48],char_const*,char[3]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [34])this,(uint *)Args,(char (*) [18])Args_1,(char **)Args_2,
             (char (*) [48])Args_3,(char **)Args_4,(char (*) [3])Args_5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}